

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_gptneox::llm_build_gptneox
          (llm_build_gptneox *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  uint32_t uVar2;
  ggml_tensor *pgVar3;
  const_reference pvVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ggml_backend_buffer *name;
  int extraout_var;
  ggml_tensor *pgVar12;
  pointer plVar13;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *attn_out;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd08;
  int iVar14;
  llama_hparams *in_stack_fffffffffffffd10;
  ggml_tensor *in_stack_fffffffffffffd18;
  ggml_tensor *in_stack_fffffffffffffd20;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd28;
  undefined4 uVar15;
  ggml_tensor *cur_00;
  llm_graph_context *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd68;
  llm_graph_context *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdc8;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  float kq_scale;
  ggml_tensor *wo;
  ggml_cgraph *gf_00;
  llm_graph_context *this_00;
  ggml_tensor *k_cur;
  ggml_tensor *v_cur;
  ggml_tensor *kq_b;
  int il_00;
  int local_6c;
  ggml_tensor *local_58;
  ggml_tensor *local_50;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd20,
             (llm_graph_params *)in_stack_fffffffffffffd18);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  uVar2 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffd10,(uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20))
  ;
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2576,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_58 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  pgVar3 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffd70);
  llm_graph_context::build_attn_inp_kv_unified((llm_graph_context *)in_stack_fffffffffffffdb0);
  for (local_6c = 0; iVar14 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
      (long)local_6c < *(long *)(in_RDI + 0x28); local_6c = local_6c + 1) {
    kq_b = local_58;
    pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_6c);
    pgVar12 = pvVar4->attn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    pgVar5 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                        (int)in_stack_fffffffffffffd10);
    il_00 = (int)pgVar5;
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    pgVar5 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                        in_stack_fffffffffffffd60);
    v_cur = pgVar5;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar14);
    this_00 = *(llm_graph_context **)(in_RDI + 0xc0);
    pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_6c);
    pgVar6 = (ggml_tensor *)ggml_add(this_00,pgVar5,pvVar4->bqkv);
    k_cur = pgVar6;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar14);
    gf_00 = *(ggml_cgraph **)(in_RDI + 0xc0);
    inp = (llm_graph_input_attn_kv_unified *)
          ggml_view_2d(gf_00,pgVar6,*(undefined8 *)(in_RDI + 0x20),(long)*(int *)(in_RDI + 0xa8),
                       pgVar6->nb[1],0);
    pgVar7 = (ggml_tensor *)ggml_cont(gf_00,inp);
    pgVar5 = *(ggml_tensor **)(in_RDI + 0xc0);
    wo = pgVar7;
    pgVar6 = (ggml_tensor *)
             ggml_view_2d(pgVar5,pgVar6,uVar2,(long)*(int *)(in_RDI + 0xa8),pgVar6->nb[1],
                          *(long *)(in_RDI + 0x20) << 2);
    uVar8 = ggml_cont(pgVar5,pgVar6);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar11 = uVar8;
    uVar9 = ggml_view_2d();
    kq_scale = (float)((ulong)uVar11 >> 0x20);
    uVar10 = ggml_cont(uVar10,uVar9);
    uVar11 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar7,uVar1,
                             *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar8,uVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    name = (ggml_backend_buffer *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar10,uVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                  *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                  *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                  *(undefined8 *)(in_RDI + 0xc0),uVar11,pgVar3,0,*(undefined4 *)(in_RDI + 0x30),
                  *(undefined4 *)(in_RDI + 0xb8));
    ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                  *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                  *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                  *(undefined8 *)(in_RDI + 0xc0),uVar8,pgVar3,0,*(undefined4 *)(in_RDI + 0x30),
                  *(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    sqrtf((float)uVar1);
    cur_00 = (ggml_tensor *)CONCAT44(uVar15,local_6c);
    mw = (ggml_tensor *)0x0;
    pgVar7 = (ggml_tensor *)0x0;
    iVar14 = extraout_var;
    local_50 = llm_graph_context::build_attn
                         (this_00,inp,gf_00,wo,pgVar6,pgVar5,k_cur,v_cur,kq_b,pgVar12,kq_scale,il_00
                         );
    if ((long)local_6c == *(long *)(in_RDI + 0x28) + -1) {
      pgVar12 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd60)
      ;
      local_50 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_50,pgVar12);
      local_58 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_58,pgVar12);
    }
    if ((*(byte *)(*(long *)(in_RDI + 8) + 2) & 1) == 0) {
      pgVar12 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_50,local_58);
      in_stack_fffffffffffffdd0 = pgVar12;
      llm_graph_context::cb((llm_graph_context *)mw,pgVar7,(char *)name,iVar14);
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffdc0 = pvVar4->ffn_norm;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      in_stack_fffffffffffffd90 =
           llm_graph_context::build_norm
                     (in_stack_fffffffffffffd30,cur_00,mw,pgVar7,
                      (llm_norm_type)((ulong)name >> 0x20),(int)name);
      in_stack_fffffffffffffdc8 = in_stack_fffffffffffffd90;
      llm_graph_context::cb((llm_graph_context *)mw,pgVar7,(char *)name,iVar14);
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd98 = pvVar4->ffn_up;
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffda0 = pvVar4->ffn_up_b;
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd18 = pvVar4->ffn_down;
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd20 = pvVar4->ffn_down_b;
      in_stack_fffffffffffffd30 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd28 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd10 = (llama_hparams *)0x0;
      in_stack_fffffffffffffd08 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd88 = in_stack_fffffffffffffd18;
      in_stack_fffffffffffffda8 = (ggml_tensor *)&stack0xfffffffffffffd08;
      pgVar5 = llm_graph_context::build_ffn
                         ((llm_graph_context *)in_stack_fffffffffffffdb0,
                          (ggml_tensor *)&stack0xfffffffffffffd08,in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                          in_stack_fffffffffffffd18,in_stack_fffffffffffffdc0,
                          in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,
                          in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffde8,(llm_ffn_op_type)in_stack_fffffffffffffdf0,
                          (llm_ffn_gate_type)in_stack_fffffffffffffdf8,
                          (int)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdb0 = pgVar5;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar5,pgVar12);
      local_58 = llm_graph_context::build_cvec
                           ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
                            ,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    }
    else {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      in_stack_fffffffffffffdf8 =
           llm_graph_context::build_norm
                     (in_stack_fffffffffffffd30,cur_00,mw,pgVar7,
                      (llm_norm_type)((ulong)name >> 0x20),(int)name);
      llm_graph_context::cb((llm_graph_context *)mw,pgVar7,(char *)name,iVar14);
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffe00 = pvVar4->ffn_up;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd18 = pvVar4->ffn_down;
      pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd20 = pvVar4->ffn_down_b;
      in_stack_fffffffffffffd30 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd28 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd10 = (llama_hparams *)0x0;
      in_stack_fffffffffffffd08 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffdf0 = in_stack_fffffffffffffd18;
      pgVar12 = llm_graph_context::build_ffn
                          ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                           in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                           in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                           in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,
                           in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                           in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
                           (llm_ffn_op_type)in_stack_fffffffffffffd18,
                           (llm_ffn_gate_type)in_stack_fffffffffffffdf8,
                           (int)in_stack_fffffffffffffe00);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      pgVar12 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar12,local_58);
      in_stack_fffffffffffffde8 = pgVar12;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      in_stack_fffffffffffffde0 =
           (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar12,local_50);
      local_58 = llm_graph_context::build_cvec
                           ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
                            ,0);
      in_stack_fffffffffffffdd8 = local_58;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    }
  }
  pgVar12 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20
                       ,in_stack_fffffffffffffd18,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                       (int)in_stack_fffffffffffffd10);
  pgVar3 = pgVar12;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             &in_stack_fffffffffffffd10->vocab_only,iVar14);
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e9d98);
  plVar13->t_embd = pgVar12;
  pgVar3 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar3,in_stack_fffffffffffffd68,pgVar12);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             &in_stack_fffffffffffffd10->vocab_only,iVar14);
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e9e1d);
  plVar13->t_logits = pgVar3;
  ggml_build_forward_expand(in_RCX,pgVar3);
  return;
}

Assistant:

llm_build_gptneox(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // ffn
            if (hparams.use_par_res) {
                // attention and ffn are computed in parallel
                // x = x + attn(ln1(x)) + ffn(ln2(x))

                ggml_tensor * attn_out = cur;

                cur = build_norm(inpL,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

                cur = ggml_add(ctx0, cur, inpL);
                cb(cur, "ffn_out", il);

                cur = ggml_add(ctx0, cur, attn_out);

                cur = build_cvec(cur, il);
                cb(cur, "l_out", il);

                // input for next layer
                inpL = cur;
            } else {
                // attention and ffn are computed sequentially
                // x = x + attn(ln1(x))
                // x = x + ffn(ln2(x))

                ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
                cb(ffn_inp, "ffn_inp", il);

                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

                cur = ggml_add(ctx0, cur, ffn_inp);

                cur = build_cvec(cur, il);
                cb(cur, "l_out", il);

                // input for next layer
                inpL = cur;
            }
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }